

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_stack.h
# Opt level: O1

type dukglue::detail::get_stack_values_helper<int,int,int,0ul,1ul,2ul>
               (_Tuple_impl<1UL,_int,_int> ctx,duk_context *param_2)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  _Head_base<0UL,_int,_false> extraout_EDX;
  type tVar4;
  
  iVar1 = types::DukType<int>::read<int>(param_2,0);
  iVar2 = types::DukType<int>::read<int>(param_2,1);
  iVar3 = types::DukType<int>::read<int>(param_2,2);
  *(int32_t *)ctx = iVar3;
  *(int32_t *)((long)ctx + 4) = iVar2;
  *(int32_t *)((long)ctx + 8) = iVar1;
  tVar4.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       extraout_EDX._M_head_impl;
  tVar4.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> = ctx;
  return (type)tVar4.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

typename ArgsTuple<Args...>::type get_stack_values_helper(duk_context* ctx, dukglue::detail::index_tuple<Indexes...>)
		{
			using namespace dukglue::types;
			return std::forward_as_tuple(DukType<typename Bare<Args>::type>::template read<typename ArgStorage<Args>::type>(ctx, Indexes)...);
		}